

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O3

void __thiscall LexerError::~LexerError(LexerError *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Lexer, Error) {
  Lexer lexer("foo$\nbad $");
  EvalString eval;
  string err;
  ASSERT_FALSE(lexer.ReadVarValue(&eval, &err));
  EXPECT_EQ("input:2: bad $-escape (literal $ must be written as $$)\n"
            "bad $\n"
            "    ^ near here"
            , err);
}